

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# query.c
# Opt level: O0

void get_comp_and_src(ecs_world_t *world,ecs_query_t *query,ecs_type_t table_type,
                     ecs_sig_column_t *column,ecs_sig_oper_kind_t op,ecs_sig_from_kind_t from,
                     ecs_entity_t *component_out,ecs_entity_t *entity_out)

{
  ecs_entity_t local_40;
  ecs_entity_t entity;
  ecs_entity_t component;
  ecs_sig_from_kind_t from_local;
  ecs_sig_oper_kind_t op_local;
  ecs_sig_column_t *column_local;
  ecs_type_t table_type_local;
  ecs_query_t *query_local;
  ecs_world_t *world_local;
  
  entity = 0;
  local_40 = 0;
  if (op == EcsOperNot) {
    local_40 = column->source;
  }
  component._0_4_ = from;
  component._4_4_ = op;
  _from_local = column;
  column_local = (ecs_sig_column_t *)table_type;
  table_type_local = (ecs_type_t)query;
  query_local = (ecs_query_t *)world;
  if ((((from == EcsFromAny) || (from == EcsFromEntity)) || (from == EcsFromOwned)) ||
     (from == EcsFromShared)) {
    if (((op == EcsOperAnd) || (op == EcsOperNot)) || (op == EcsOperOptional)) {
      entity = (column->is).component;
    }
    else if (op == EcsOperAll) {
      entity = (column->is).component & 0xffffffffffffff;
    }
    else if (op == EcsOperOr) {
      entity = ecs_type_contains(world,table_type,(column->is).type,false,true);
    }
    if ((ecs_sig_from_kind_t)component == EcsFromEntity) {
      local_40 = _from_local->source;
    }
  }
  else if (from == EcsFromEmpty) {
    entity = (column->is).component;
  }
  else if ((from == EcsFromParent) || (from == EcsCascade)) {
    if ((op == EcsOperAnd) || (op == EcsOperOptional)) {
      entity = (column->is).component;
      local_40 = ecs_find_in_type(world,table_type,entity,0xfd00000000000000);
    }
    else if (op == EcsOperOr) {
      entity = components_contains(world,table_type,(column->is).type,&local_40,false);
    }
  }
  else if (from == EcsFromSystem) {
    if (op == EcsOperAnd) {
      entity = (column->is).component;
    }
    local_40 = query->system;
  }
  *component_out = entity;
  *entity_out = local_40;
  return;
}

Assistant:

static
void get_comp_and_src(
    ecs_world_t *world,
    ecs_query_t *query,
    ecs_type_t table_type,
    ecs_sig_column_t *column,
    ecs_sig_oper_kind_t op,
    ecs_sig_from_kind_t from,
    ecs_entity_t *component_out,
    ecs_entity_t *entity_out)
{
    ecs_entity_t component = 0, entity = 0;

    if (op == EcsOperNot) {
        entity = column->source;
    }

    /* Column that retrieves data from self or a fixed entity */
    if (from == EcsFromAny || from == EcsFromEntity || 
        from == EcsFromOwned || from == EcsFromShared) 
    {
        if (op == EcsOperAnd || op == EcsOperNot || op == EcsOperOptional) {
            component = column->is.component;
        } else if (op == EcsOperAll) {
            component = column->is.component & ECS_COMPONENT_MASK;
        } else if (op == EcsOperOr) {
            component = ecs_type_contains(
                world, table_type, column->is.type, 
                false, true);
        }

        if (from == EcsFromEntity) {
            entity = column->source;
        }

    /* Column that just passes a handle to the system (no data) */
    } else if (from == EcsFromEmpty) {
        component = column->is.component;

    /* Column that retrieves data from a dynamic entity */
    } else if (from == EcsFromParent || from == EcsCascade) {
        if (op == EcsOperAnd ||
            op == EcsOperOptional)
        {
            component = column->is.component;
            entity = ecs_find_in_type(
                world, table_type, component, ECS_CHILDOF);

        } else if (op == EcsOperOr) {
            component = components_contains(
                world,
                table_type,
                column->is.type,
                &entity,
                false);
        }

    /* Column that retrieves data from a system */
    } else if (from == EcsFromSystem) {
        if (op == EcsOperAnd) {
            component = column->is.component;
        }

        entity = query->system;
    }

    *component_out = component;
    *entity_out = entity;
}